

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_tet_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  int local_468;
  int local_43c;
  int local_410;
  int local_3e4;
  int local_3b8;
  long local_380;
  REF_INT local_370;
  long local_368;
  long local_348;
  long local_318;
  REF_INT local_308;
  long local_300;
  long local_2e0;
  long local_2b0;
  REF_INT local_2a0;
  long local_298;
  long local_278;
  long local_248;
  REF_INT local_238;
  long local_230;
  long local_210;
  int local_1f0;
  int local_1c4;
  int local_198;
  int local_16c;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell;
  REF_INT nnodesg;
  REF_INT local [27];
  REF_INT global [27];
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_private_macro_code_rss = 4;
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x61,
           "ref_fixture_tet_grid",(ulong)uVar2,"create");
    return uVar2;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node_00 = pRVar1->node;
  local[0x1a] = 0;
  if (0 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
    local_16c = 0 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_16c = -((ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                 ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  if (ref_mpi->id == local_16c) {
LAB_00127c62:
    uVar2 = ref_node_add(ref_node_00,0,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x72,"ref_fixture_tet_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = 0.0;
    ref_node_00->real[cell * 0xf + 1] = 0.0;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_210 = -1;
    }
    else {
      local_210 = ref_node_00->global[cell];
    }
    if (local_210 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(ref_private_macro_code_rss -
              ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_230 = -1;
      }
      else {
        local_230 = ref_node_00->global[cell];
      }
      local_238 = (REF_INT)(local_230 /
                           (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_248 = -1;
      }
      else {
        local_248 = ref_node_00->global[cell];
      }
      local_238 = (int)((local_248 -
                        (ref_private_macro_code_rss -
                        ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                        ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_238;
    uVar2 = ref_node_add(ref_node_00,1,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x73,"ref_fixture_tet_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[nnodesg * 0xf] = 1.0;
    ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_278 = -1;
    }
    else {
      local_278 = ref_node_00->global[nnodesg];
    }
    if (local_278 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(ref_private_macro_code_rss -
              ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_298 = -1;
      }
      else {
        local_298 = ref_node_00->global[nnodesg];
      }
      local_2a0 = (REF_INT)(local_298 /
                           (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_2b0 = -1;
      }
      else {
        local_2b0 = ref_node_00->global[nnodesg];
      }
      local_2a0 = (int)((local_2b0 -
                        (ref_private_macro_code_rss -
                        ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                        ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_2a0;
    uVar2 = ref_node_add(ref_node_00,2,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x74,"ref_fixture_tet_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 0.0;
    ref_node_00->real[local[0] * 0xf + 1] = 1.0;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_2e0 = -1;
    }
    else {
      local_2e0 = ref_node_00->global[local[0]];
    }
    if (local_2e0 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(ref_private_macro_code_rss -
              ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_300 = -1;
      }
      else {
        local_300 = ref_node_00->global[local[0]];
      }
      local_308 = (REF_INT)(local_300 /
                           (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_318 = -1;
      }
      else {
        local_318 = ref_node_00->global[local[0]];
      }
      local_308 = (int)((local_318 -
                        (ref_private_macro_code_rss -
                        ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                        ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_308;
    uVar2 = ref_node_add(ref_node_00,3,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x75,"ref_fixture_tet_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[1] * 0xf] = 0.0;
    ref_node_00->real[local[1] * 0xf + 1] = 0.0;
    ref_node_00->real[local[1] * 0xf + 2] = 1.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_348 = -1;
    }
    else {
      local_348 = ref_node_00->global[local[1]];
    }
    if (local_348 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(ref_private_macro_code_rss -
              ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_368 = -1;
      }
      else {
        local_368 = ref_node_00->global[local[1]];
      }
      local_370 = (REF_INT)(local_368 /
                           (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_380 = -1;
      }
      else {
        local_380 = ref_node_00->global[local[1]];
      }
      local_370 = (int)((local_380 -
                        (ref_private_macro_code_rss -
                        ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                        ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_370;
    uVar2 = ref_cell_add(pRVar1->cell[8],&cell,&ref_private_macro_code_rss_1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x77,"ref_fixture_tet_grid",(ulong)uVar2,"add tet");
      return uVar2;
    }
  }
  else {
    if (1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))
    {
      local_198 = 1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_198 = (1 - (ref_private_macro_code_rss -
                       ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                       ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_198) goto LAB_00127c62;
    if (2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))
    {
      local_1c4 = 2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_1c4 = (2 - (ref_private_macro_code_rss -
                       ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                       ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_1c4) goto LAB_00127c62;
    if (3 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))
    {
      local_1f0 = 3 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_1f0 = (3 - (ref_private_macro_code_rss -
                       ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                       ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_1f0) goto LAB_00127c62;
  }
  uVar2 = ref_node_initialize_n_global(ref_node_00,(long)ref_private_macro_code_rss);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x7a,
           "ref_fixture_tet_grid",(ulong)uVar2,"init glob");
    return uVar2;
  }
  local[0x1a] = 0;
  if (0 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
    local_3b8 = 0 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_3b8 = -((ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                 ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  if (ref_mpi->id != local_3b8) {
    if (1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))
    {
      local_3e4 = 1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_3e4 = (1 - (ref_private_macro_code_rss -
                       ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                       ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    if (ref_mpi->id != local_3e4) {
      if (2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
          ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)
         ) {
        local_410 = 2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
      }
      else {
        local_410 = (2 - (ref_private_macro_code_rss -
                         ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                         ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                    ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                    (ref_private_macro_code_rss -
                    ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
      }
      if (ref_mpi->id != local_410) goto LAB_00129193;
    }
  }
  uVar2 = ref_node_local(ref_node_00,0,&cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x86,
           "ref_fixture_tet_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  uVar2 = ref_node_local(ref_node_00,1,&nnodesg);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x87,
           "ref_fixture_tet_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  uVar2 = ref_node_local(ref_node_00,2,local);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x88,
           "ref_fixture_tet_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  local[1] = 10;
  uVar2 = ref_cell_add(pRVar1->cell[3],&cell,&ref_private_macro_code_rss_1);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x8a,
           "ref_fixture_tet_grid",(ulong)uVar2,"add tri");
    return uVar2;
  }
LAB_00129193:
  local[0x1a] = 1;
  if (1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
    local_43c = 1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_43c = (1 - (ref_private_macro_code_rss -
                     ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                     ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  if (ref_mpi->id != local_43c) {
    if (2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))
    {
      local_468 = 2 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_468 = (2 - (ref_private_macro_code_rss -
                       ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                       ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    if (ref_mpi->id != local_468) {
      return 0;
    }
  }
  uVar2 = ref_node_local(ref_node_00,1,&cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x94,
           "ref_fixture_tet_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  uVar2 = ref_node_local(ref_node_00,2,&nnodesg);
  if (uVar2 == 0) {
    local[1] = 0x14;
    uVar2 = ref_cell_add(pRVar1->cell[0],&cell,&ref_private_macro_code_rss_1);
    if (uVar2 == 0) {
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x97,
           "ref_fixture_tet_grid",(ulong)uVar2,"add edg");
    return uVar2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x95,
         "ref_fixture_tet_grid",(ulong)uVar2,"loc");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tet_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT nnodesg = 4;
  REF_INT cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;

  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);

    RSS(ref_cell_add(ref_grid_tet(ref_grid), local, &cell), "add tet");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 1;
  global[1] = 2;
  global[3] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  return REF_SUCCESS;
}